

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raster.cpp
# Opt level: O3

void rw::conv_RGBA8888_from_ARGB1555(uint8 *out,uint8 *in)

{
  byte bVar1;
  byte bVar2;
  
  bVar1 = in[1];
  bVar2 = *in;
  *out = (uint8)(((bVar1 >> 2 & 0x1f) * 0xff) / 0x1f);
  out[1] = (uint8)(((uint)(bVar2 >> 5) + (bVar1 & 3) * 8) * 0x20e7f7 >> 0x12);
  out[2] = (uint8)(((bVar2 & 0x1f) * 0xff) / 0x1f);
  out[3] = (char)bVar1 >> 7;
  return;
}

Assistant:

void
conv_RGBA8888_from_ARGB1555(uint8 *out, uint8 *in)
{
	uint32 r, g, b, a;
	a = (in[1]>>7) & 1;
	r = (in[1]>>2) & 0x1F;
	g = (in[1]&3)<<3 | ((in[0]>>5)&7);
	b = in[0] & 0x1F;
	out[0] = r*0xFF/0x1f;
	out[1] = g*0xFF/0x1f;
	out[2] = b*0xFF/0x1f;
	out[3] = a*0xFF;
}